

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.cpp
# Opt level: O0

string * __thiscall
Catch::(anonymous_namespace)::createMetadataString_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,IConfig *config)

{
  bool bVar1;
  TestSpec *pTVar2;
  ReusableStringStream *pRVar3;
  uint local_38 [4];
  undefined1 local_28 [8];
  ReusableStringStream sstr;
  IConfig *config_local;
  
  sstr.m_oss = (ostream *)this;
  ReusableStringStream::ReusableStringStream((ReusableStringStream *)local_28);
  pTVar2 = (TestSpec *)(**(code **)(*(long *)sstr.m_oss + 0x68))();
  bVar1 = TestSpec::hasFilters(pTVar2);
  if (bVar1) {
    pRVar3 = ReusableStringStream::operator<<
                       ((ReusableStringStream *)local_28,(char (*) [10])"filters=\'");
    pTVar2 = (TestSpec *)(**(code **)(*(long *)sstr.m_oss + 0x68))();
    pRVar3 = ReusableStringStream::operator<<(pRVar3,pTVar2);
    ReusableStringStream::operator<<(pRVar3,(char (*) [3])"\' ");
  }
  pRVar3 = ReusableStringStream::operator<<
                     ((ReusableStringStream *)local_28,(char (*) [10])"rng-seed=");
  local_38[0] = (**(code **)(*(long *)sstr.m_oss + 0x88))();
  ReusableStringStream::operator<<(pRVar3,local_38);
  ReusableStringStream::str_abi_cxx11_(__return_storage_ptr__,(ReusableStringStream *)local_28);
  ReusableStringStream::~ReusableStringStream((ReusableStringStream *)local_28);
  return __return_storage_ptr__;
}

Assistant:

std::string createMetadataString(IConfig const& config) {
            ReusableStringStream sstr;
            if ( config.testSpec().hasFilters() ) {
                sstr << "filters='"
                         << config.testSpec()
                         << "' ";
            }
            sstr << "rng-seed=" << config.rngSeed();
            return sstr.str();
        }